

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MAW.cpp
# Opt level: O1

void __thiscall OpenMD::MAW::initialize(MAW *this)

{
  vector<int,_std::allocator<int>_> *this_00;
  pointer piVar1;
  pointer pcVar2;
  size_t sVar3;
  undefined8 uVar4;
  bool bVar5;
  AtomType *this_01;
  AtomType *this_02;
  long lVar6;
  _Base_ptr p_Var7;
  _Rb_tree_header *p_Var8;
  NonBondedInteractionType *this_03;
  int atid2;
  int atid1;
  int local_b0;
  int local_ac;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  undefined1 local_88 [40];
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *local_60;
  string local_58;
  _Base_ptr local_38;
  
  local_60 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
             &this->MAWtypes;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_60);
  this_00 = &this->MAWtids;
  piVar1 = (this->MAWtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->MAWtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar1) {
    (this->MAWtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar1;
  }
  std::
  vector<std::vector<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>,_std::allocator<std::vector<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>_>_>
  ::_M_erase_at_end(&this->MixingMap,
                    (this->MixingMap).
                    super__Vector_base<std::vector<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>,_std::allocator<std::vector<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  local_88._0_4_ = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::resize
            (this_00,(this->forceField_->atomTypeCont_).data_._M_t._M_impl.super__Rb_tree_header.
                     _M_node_count,(value_type_conflict2 *)local_88);
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var7 = (this->forceField_->nonBondedInteractionTypeCont_).data_._M_t._M_impl.
           super__Rb_tree_header._M_header._M_left;
  p_Var8 = &(this->forceField_->nonBondedInteractionTypeCont_).data_._M_t._M_impl.
            super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var7 == p_Var8) {
    this_03 = (NonBondedInteractionType *)0x0;
  }
  else {
    this_03 = *(NonBondedInteractionType **)(p_Var7 + 2);
  }
  while (this_03 != (NonBondedInteractionType *)0x0) {
    bVar5 = NonBondedInteractionType::isMAW(this_03);
    if (bVar5) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_58,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(p_Var7 + 1));
      local_88._16_8_ =
           local_a8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_88._8_8_ =
           local_a8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_88._0_8_ =
           local_a8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_58._M_dataplus._M_p;
      local_a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_58._M_string_length;
      local_a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)local_58.field_2._M_allocated_capacity;
      local_58._M_dataplus._M_p = (pointer)0x0;
      local_58._M_string_length = 0;
      local_58.field_2._M_allocated_capacity = 0;
      local_38 = p_Var7;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_88);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_58);
      this_01 = ForceField::getAtomType
                          (this->forceField_,
                           local_a8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
      if (this_01 == (AtomType *)0x0) {
        pcVar2 = ((local_a8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
        snprintf(painCave.errMsg,2000,
                 "MAW::initialize could not find AtomType %s\n\tto for for %s - %s interaction.\n",
                 pcVar2,pcVar2,
                 local_a8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
        painCave.isFatal = 1;
        painCave.severity = 1;
        simError();
      }
      this_02 = ForceField::getAtomType
                          (this->forceField_,
                           local_a8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + 1);
      if (this_02 == (AtomType *)0x0) {
        pcVar2 = local_a8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
        snprintf(painCave.errMsg,2000,
                 "MAW::initialize could not find AtomType %s\n\tfor %s - %s nonbonded interaction.\n"
                 ,pcVar2,((local_a8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,pcVar2);
        painCave.isFatal = 1;
        painCave.severity = 1;
        simError();
      }
      local_ac = AtomType::getIdent(this_01);
      if ((this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_start[local_ac] == -1) {
        sVar3 = (this->MAWtypes)._M_t._M_impl.super__Rb_tree_header._M_node_count;
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>(local_60,&local_ac);
        (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_start[local_ac] = (int)sVar3;
      }
      local_b0 = AtomType::getIdent(this_02);
      if ((this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_start[local_b0] == -1) {
        sVar3 = (this->MAWtypes)._M_t._M_impl.super__Rb_tree_header._M_node_count;
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>(local_60,&local_b0);
        (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_start[local_b0] = (int)sVar3;
      }
      lVar6 = __dynamic_cast(this_03,&NonBondedInteractionType::typeinfo,
                             &MAWInteractionType::typeinfo,0);
      if (lVar6 == 0) {
        AtomType::getName_abi_cxx11_((string *)local_88,this_01);
        uVar4 = local_88._0_8_;
        AtomType::getName_abi_cxx11_(&local_58,this_02);
        snprintf(painCave.errMsg,2000,
                 "MAW::initialize could not convert NonBondedInteractionType\n\tto MAWInteractionType for %s - %s interaction.\n"
                 ,uVar4,local_58._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        if ((string *)local_88._0_8_ != (string *)(local_88 + 0x10)) {
          operator_delete((void *)local_88._0_8_,(ulong)(local_88._16_8_ + 1));
        }
        painCave.isFatal = 1;
        painCave.severity = 1;
        simError();
      }
      addExplicitInteraction
                (this,this_01,this_02,*(RealType *)(lVar6 + 0x60),*(RealType *)(lVar6 + 0x68),
                 *(RealType *)(lVar6 + 0x70),*(RealType *)(lVar6 + 0x78),*(RealType *)(lVar6 + 0x80)
                );
      p_Var7 = local_38;
    }
    p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    if ((_Rb_tree_header *)p_Var7 == p_Var8) {
      this_03 = (NonBondedInteractionType *)0x0;
    }
    else {
      this_03 = *(NonBondedInteractionType **)(p_Var7 + 2);
    }
  }
  this->initialized_ = true;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8);
  return;
}

Assistant:

void MAW::initialize() {
    MAWtypes.clear();
    MAWtids.clear();
    MixingMap.clear();
    MAWtids.resize(forceField_->getNAtomType(), -1);

    ForceField::NonBondedInteractionTypeContainer* nbiTypes =
        forceField_->getNonBondedInteractionTypes();
    ForceField::NonBondedInteractionTypeContainer::MapTypeIterator j;
    ForceField::NonBondedInteractionTypeContainer::KeyType keys;
    NonBondedInteractionType* nbt;
    int mtid1, mtid2;

    for (nbt = nbiTypes->beginType(j); nbt != NULL;
         nbt = nbiTypes->nextType(j)) {
      if (nbt->isMAW()) {
        keys          = nbiTypes->getKeys(j);
        AtomType* at1 = forceField_->getAtomType(keys[0]);
        if (at1 == NULL) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "MAW::initialize could not find AtomType %s\n"
                   "\tto for for %s - %s interaction.\n",
                   keys[0].c_str(), keys[0].c_str(), keys[1].c_str());
          painCave.severity = OPENMD_ERROR;
          painCave.isFatal  = 1;
          simError();
        }

        AtomType* at2 = forceField_->getAtomType(keys[1]);
        if (at2 == NULL) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "MAW::initialize could not find AtomType %s\n"
                   "\tfor %s - %s nonbonded interaction.\n",
                   keys[1].c_str(), keys[0].c_str(), keys[1].c_str());
          painCave.severity = OPENMD_ERROR;
          painCave.isFatal  = 1;
          simError();
        }

        int atid1 = at1->getIdent();
        if (MAWtids[atid1] == -1) {
          mtid1 = MAWtypes.size();
          MAWtypes.insert(atid1);
          MAWtids[atid1] = mtid1;
        }
        int atid2 = at2->getIdent();
        if (MAWtids[atid2] == -1) {
          mtid2 = MAWtypes.size();
          MAWtypes.insert(atid2);
          MAWtids[atid2] = mtid2;
        }

        MAWInteractionType* mit = dynamic_cast<MAWInteractionType*>(nbt);

        if (mit == NULL) {
          snprintf(
              painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
              "MAW::initialize could not convert NonBondedInteractionType\n"
              "\tto MAWInteractionType for %s - %s interaction.\n",
              at1->getName().c_str(), at2->getName().c_str());
          painCave.severity = OPENMD_ERROR;
          painCave.isFatal  = 1;
          simError();
        }

        RealType De   = mit->getD();
        RealType beta = mit->getBeta();
        RealType Re   = mit->getR();
        RealType ca1  = mit->getCA1();
        RealType cb1  = mit->getCB1();

        addExplicitInteraction(at1, at2, De, beta, Re, ca1, cb1);
      }
    }
    initialized_ = true;
  }